

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  istream *piVar2;
  Vector2d q;
  Vector2d X;
  Scalar local_70;
  lmik solver;
  
  solver.W_N_bar.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [0] = (double)&q;
  solver.W_N_bar.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [1] = 0.0;
  solver.W_N_bar.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [2] = 4.94065645841247e-324;
  solver.W_N_bar.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
  [3] = 4.94065645841247e-324;
  q.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       1.5707963267948966;
  local_70 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&solver,&local_70);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&solver);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter the target position (x, y)");
  std::endl<char,std::char_traits<char>>(poVar1);
  piVar2 = std::istream::_M_extract<double>((double *)&std::cin);
  std::istream::_M_extract<double>((double *)piVar2);
  lmik::lmik(&solver);
  lmik::solve(&solver,&q,&X);
  std::operator<<((ostream *)&std::cout,"q(0): ");
  poVar1 = std::ostream::_M_insert<double>
                     (q.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                      m_data.array[0]);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"q(1): ");
  poVar1 = std::ostream::_M_insert<double>
                     (q.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                      m_data.array[1]);
  std::endl<char,std::char_traits<char>>(poVar1);
  lmik::~lmik(&solver);
  return 0;
}

Assistant:

int main() {    
    Vector2d q, X, ans;
    q << M_PI_2, 0;
    
    cout << "Enter the target position (x, y)" << endl;
    cin >> X(0) >> X(1);

    lmik solver;
    solver.solve(q, X);
    cout << "q(0): " << q(0) << endl;
    cout << "q(1): " << q(1) << endl;
    
    return 0;
}